

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void anon_unknown.dwarf_1df8047::addFileSetEntry
               (cmGeneratorTarget *headTarget,string *config,
               cmGeneratorExpressionDAGChecker *dagChecker,cmFileSet *fileSet,
               EvaluatedTargetPropertyEntries *entries)

{
  pointer pcVar1;
  pointer pcVar2;
  size_type sVar3;
  cmMakefile *this;
  int iVar4;
  cmSourceFile *this_00;
  string *psVar5;
  cmSourceGroup *pcVar6;
  pointer puVar7;
  bool bVar8;
  string *sourceName;
  undefined1 uVar9;
  cmSourceGroup *sg;
  _Base_ptr p_Var10;
  pointer this_01;
  string w;
  string e;
  string path;
  TargetPropertyEntryFileSet tpe;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  dirCges;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string local_1c0;
  cmGeneratorTarget *local_1a0;
  _Head_base<0UL,_cmCompiledGeneratorExpression_*,_false> local_198;
  undefined1 local_190 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  undefined1 local_158 [32];
  _Alloc_hider local_138;
  cmake *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  TargetPropertyEntry local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  undefined1 local_e0;
  _Head_base<0UL,_cmCompiledGeneratorExpression_*,_false> local_d8;
  undefined1 local_d0 [16];
  pointer pbStack_c0;
  pointer pbStack_b8;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  cmGeneratorExpressionDAGChecker *local_98;
  _Base_ptr local_90;
  string *local_88;
  _Base_ptr local_80;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_78;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_138._M_p = (pointer)entries;
  cmFileSet::CompileDirectoryEntries(&local_60,fileSet);
  local_a0 = (_Base_ptr)config;
  local_98 = dagChecker;
  cmFileSet::EvaluateDirectoryEntries
            (&local_48,fileSet,&local_60,headTarget->LocalGenerator,config,headTarget,dagChecker);
  if (local_60.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_60.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    do {
      puVar7 = local_60.
               super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
      if ((((local_60.
             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
           .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
          HadContextSensitiveCondition != false) {
        uVar9 = 1;
        break;
      }
      local_60.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = puVar7;
    } while (puVar7 != local_60.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_130 = cmLocalGenerator::GetCMakeInstance(headTarget->LocalGenerator);
  cmFileSet::CompileFileEntries(&local_78,fileSet);
  local_a8 = (_Base_ptr)
             local_78.
             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_78.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var10 = (_Base_ptr)
              local_78.
              super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_1a0 = headTarget;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_d0 + 8),&local_48);
      local_d8._M_head_impl = *(cmCompiledGeneratorExpression **)p_Var10;
      *(__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
        *)p_Var10 = (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
                     )0x0;
      local_108.LinkImplItem = &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem;
      local_108._vptr_TargetPropertyEntry = (_func_int **)&PTR__TargetPropertyEntryFileSet_00965960;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d0._8_8_;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbStack_c0;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbStack_b8;
      local_d0._8_8_ = (_Base_ptr)0x0;
      pbStack_c0 = (pointer)0x0;
      pbStack_b8 = (pointer)0x0;
      local_198._M_head_impl = (cmCompiledGeneratorExpression *)0x0;
      local_e0 = uVar9;
      local_d0._0_8_ = fileSet;
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)&local_198);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_d0 + 8));
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
      EvaluateTargetPropertyEntry
                ((EvaluatedTargetPropertyEntry *)local_190,headTarget,(string *)local_a0,&local_1c0,
                 local_98,&local_108);
      std::
      vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ::emplace_back<(anonymous_namespace)::EvaluatedTargetPropertyEntry>
                ((vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                  *)local_138._M_p,(EvaluatedTargetPropertyEntry *)local_190);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_178);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_190._17_7_,local_190[0x10])
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT71(local_190._17_7_,local_190[0x10]));
      }
      local_90 = p_Var10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,
                        CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                                 local_1c0.field_2._M_local_buf[0]) + 1);
      }
      sourceName = (*(pointer *)(local_138._M_p + 8))[-1].Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      local_88 = (*(pointer *)(local_138._M_p + 8))[-1].Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (sourceName != local_88) {
        do {
          this_00 = cmMakefile::GetOrCreateSource(headTarget->Makefile,sourceName,false,Ambiguous);
          if (((fileSet->Type)._M_string_length == 7) &&
             (iVar4 = bcmp((fileSet->Type)._M_dataplus._M_p,"HEADERS",7), iVar4 == 0)) {
            local_190._0_8_ = local_190 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_190,"HEADER_FILE_ONLY","");
            cmSourceFile::SetProperty(this_00,(string *)local_190,"TRUE");
            if ((cmLinkImplItem *)local_190._0_8_ != (cmLinkImplItem *)(local_190 + 0x10)) {
              operator_delete((void *)local_190._0_8_,CONCAT71(local_190._17_7_,local_190[0x10]) + 1
                             );
            }
          }
          local_190._0_8_ = local_190 + 0x10;
          local_190._8_8_ = (element_type *)0x0;
          local_190[0x10] = '\0';
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          local_1c0._M_string_length = 0;
          local_1c0.field_2._M_local_buf[0] = '\0';
          psVar5 = cmSourceFile::ResolveFullPath(this_00,(string *)local_190,&local_1c0);
          local_128._M_allocated_capacity = (size_type)&local_118;
          pcVar1 = (psVar5->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,pcVar1,pcVar1 + psVar5->_M_string_length);
          if (local_1c0._M_string_length != 0) {
            cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_158);
            cmake::IssueMessage(local_130,AUTHOR_WARNING,&local_1c0,(cmListFileBacktrace *)local_158
                               );
            if ((cmMakefile *)local_158._8_8_ != (cmMakefile *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
            }
          }
          local_80 = (_Base_ptr)local_128._8_8_;
          if (local_128._8_8_ == 0) {
            if ((element_type *)local_190._8_8_ != (element_type *)0x0) {
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_158);
              cmake::IssueMessage(local_130,FATAL_ERROR,(string *)local_190,
                                  (cmListFileBacktrace *)local_158);
              if ((cmMakefile *)local_158._8_8_ != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
              }
            }
          }
          else {
            this_01 = (headTarget->Makefile->SourceGroups).
                      super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pcVar2 = (headTarget->Makefile->SourceGroups).
                     super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (this_01 != pcVar2) {
              do {
                pcVar6 = cmSourceGroup::MatchChildrenFiles(this_01,(string *)&local_128);
                bVar8 = false;
                if (pcVar6 != (cmSourceGroup *)0x0) {
                  bVar8 = true;
                  break;
                }
                this_01 = this_01 + 1;
              } while (this_01 != pcVar2);
              if (bVar8) goto LAB_004c9184;
            }
            pcVar1 = (fileSet->Type)._M_dataplus._M_p;
            sVar3 = (fileSet->Type)._M_string_length;
            if (sVar3 == 0x17) {
              iVar4 = bcmp(pcVar1,"CXX_MODULE_HEADER_UNITS",0x17);
            }
            else {
              if (sVar3 != 7) goto LAB_004c9184;
              iVar4 = bcmp(pcVar1,"HEADERS",7);
            }
            if (iVar4 == 0) {
              this = local_1a0->Makefile;
              local_158._0_8_ = (cmTarget *)(local_158 + 0x10);
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"Header Files","")
              ;
              pcVar6 = cmMakefile::GetOrCreateSourceGroup(this,(string *)local_158);
              cmSourceGroup::AddGroupFile(pcVar6,(string *)&local_128);
              if ((cmTarget *)local_158._0_8_ != (cmTarget *)(local_158 + 0x10)) {
                operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
              }
            }
          }
LAB_004c9184:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_allocated_capacity != &local_118) {
            operator_delete((void *)local_128._M_allocated_capacity,
                            local_118._M_allocated_capacity + 1);
          }
          headTarget = local_1a0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,
                            CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                                     local_1c0.field_2._M_local_buf[0]) + 1);
          }
          if ((cmLinkImplItem *)local_190._0_8_ != (cmLinkImplItem *)(local_190 + 0x10)) {
            operator_delete((void *)local_190._0_8_,CONCAT71(local_190._17_7_,local_190[0x10]) + 1);
          }
          if (local_80 == (_Base_ptr)0x0) {
            local_108._vptr_TargetPropertyEntry =
                 (_func_int **)&PTR__TargetPropertyEntryFileSet_00965960;
            std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)&local_d8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_f8);
            goto LAB_004c9279;
          }
          sourceName = sourceName + 1;
        } while (sourceName != local_88);
      }
      local_108._vptr_TargetPropertyEntry = (_func_int **)&PTR__TargetPropertyEntryFileSet_00965960;
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)&local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f8);
      p_Var10 = (_Base_ptr)&local_90->_M_parent;
    } while (p_Var10 != local_a8);
  }
LAB_004c9279:
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_60);
  return;
}

Assistant:

void addFileSetEntry(cmGeneratorTarget const* headTarget,
                     std::string const& config,
                     cmGeneratorExpressionDAGChecker* dagChecker,
                     cmFileSet const* fileSet,
                     EvaluatedTargetPropertyEntries& entries)
{
  auto dirCges = fileSet->CompileDirectoryEntries();
  auto dirs = fileSet->EvaluateDirectoryEntries(
    dirCges, headTarget->GetLocalGenerator(), config, headTarget, dagChecker);
  bool contextSensitiveDirs = false;
  for (auto const& dirCge : dirCges) {
    if (dirCge->GetHadContextSensitiveCondition()) {
      contextSensitiveDirs = true;
      break;
    }
  }
  cmake* cm = headTarget->GetLocalGenerator()->GetCMakeInstance();
  for (auto& entryCge : fileSet->CompileFileEntries()) {
    TargetPropertyEntryFileSet tpe(dirs, contextSensitiveDirs,
                                   std::move(entryCge), fileSet);
    entries.Entries.emplace_back(
      EvaluateTargetPropertyEntry(headTarget, config, "", dagChecker, tpe));
    for (auto const& file : entries.Entries.back().Values) {
      auto* sf = headTarget->Makefile->GetOrCreateSource(file);
      if (fileSet->GetType() == "HEADERS"_s) {
        sf->SetProperty("HEADER_FILE_ONLY", "TRUE");
      }

#ifndef CMAKE_BOOTSTRAP
      std::string e;
      std::string w;
      auto path = sf->ResolveFullPath(&e, &w);
      if (!w.empty()) {
        cm->IssueMessage(MessageType::AUTHOR_WARNING, w,
                         headTarget->GetBacktrace());
      }
      if (path.empty()) {
        if (!e.empty()) {
          cm->IssueMessage(MessageType::FATAL_ERROR, e,
                           headTarget->GetBacktrace());
        }
        return;
      }
      bool found = false;
      for (auto const& sg : headTarget->Makefile->GetSourceGroups()) {
        if (sg.MatchChildrenFiles(path)) {
          found = true;
          break;
        }
      }
      if (!found) {
        if (fileSet->GetType() == "HEADERS"_s ||
            fileSet->GetType() == "CXX_MODULE_HEADER_UNITS"_s) {
          headTarget->Makefile->GetOrCreateSourceGroup("Header Files")
            ->AddGroupFile(path);
        }
      }
#endif
    }
  }
}